

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

void lws_buflist_describe(lws_buflist **head,void *id,char *reason)

{
  size_t sVar1;
  size_t sVar2;
  lws_buflist *plVar3;
  ulong uVar4;
  
  plVar3 = *head;
  if (plVar3 == (lws_buflist *)0x0) {
    _lws_log(4,"%p: %s: buflist empty\n",id,reason);
    plVar3 = *head;
  }
  uVar4 = 0;
  do {
    if (plVar3 == (lws_buflist *)0x0) {
      return;
    }
    sVar1 = plVar3->len;
    sVar2 = plVar3->pos;
    _lws_log(4,"%p: %s: %d: %llu / %llu (%llu left)\n",id,reason,uVar4,sVar2,sVar1);
    head = &((lws_buflist *)head)->next->next;
    plVar3 = ((lws_buflist *)head)->next;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (plVar3 != (lws_buflist *)head);
  _lws_log(1,"%s: next points to self\n","lws_buflist_describe",sVar1 - sVar2);
  return;
}

Assistant:

void
lws_buflist_describe(struct lws_buflist **head, void *id, const char *reason)
{
	struct lws_buflist *old;
	int n = 0;

	if (*head == NULL)
		lwsl_notice("%p: %s: buflist empty\n", id, reason);

	while (*head) {
		lwsl_notice("%p: %s: %d: %llu / %llu (%llu left)\n", id,
			    reason, n,
			    (unsigned long long)(*head)->pos,
			    (unsigned long long)(*head)->len,
			    (unsigned long long)(*head)->len - (*head)->pos);
		old = *head;
		head = &((*head)->next);
		if (*head == old) {
			lwsl_err("%s: next points to self\n", __func__);
			break;
		}
		n++;
	}
}